

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O2

bool __thiscall cmCTestVC::InitialCheckout(cmCTestVC *this,char *command)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  string *arg;
  pointer pbVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  OutputLogger out;
  vector<const_char_*,_std::allocator<const_char_*>_> vc_co;
  string parent;
  char *local_208 [4];
  ostringstream cmCTestLog_msg;
  OutputLogger err;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"   First perform the initial checkout: ");
  poVar3 = std::operator<<(poVar3,command);
  std::operator<<(poVar3,"\n");
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestVC.cxx"
               ,0x2a,(char *)out.super_LineParser.super_OutputParser._vptr_OutputParser,false);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  cmsys::SystemTools::GetFilenamePath(&parent,&this->SourceDirectory);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"   Perform checkout in directory: ");
  poVar3 = std::operator<<(poVar3,(string *)&parent);
  std::operator<<(poVar3,"\n");
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestVC.cxx"
               ,0x2f,(char *)out.super_LineParser.super_OutputParser._vptr_OutputParser,false);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar2 = cmsys::SystemTools::MakeDirectory(&parent,(mode_t *)0x0);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,command,(allocator<char> *)&out);
    cmSystemTools::ParseArguments(&args,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    vc_co.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vc_co.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vc_co.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
              (&vc_co,((long)args.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)args.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
    for (pbVar4 = args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 != args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      _cmCTestLog_msg = (pbVar4->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&vc_co,(char **)&cmCTestLog_msg)
      ;
    }
    _cmCTestLog_msg = (pointer)0x0;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&vc_co,(char **)&cmCTestLog_msg);
    std::operator<<(this->Log,"--- Begin Initial Checkout ---\n");
    cmProcessTools::OutputLogger::OutputLogger(&out,this->Log,"co-out> ");
    cmProcessTools::OutputLogger::OutputLogger(&err,this->Log,"co-err> ");
    bVar2 = RunChild(this,vc_co.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&out,
                     (OutputParser *)&err,parent._M_dataplus._M_p,Auto);
    std::operator<<(this->Log,"--- End Initial Checkout ---\n");
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Initial checkout failed!");
      std::endl<char,std::char_traits<char>>(poVar3);
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestVC.cxx"
                   ,0x47,local_208[0],false);
      std::__cxx11::string::~string((string *)local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
    cmProcessTools::LineParser::~LineParser(&out.super_LineParser);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&vc_co.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Cannot create directory: ");
    poVar3 = std::operator<<(poVar3,(string *)&parent);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestVC.cxx"
                 ,0x32,(char *)out.super_LineParser.super_OutputParser._vptr_OutputParser,false);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&parent);
  return bVar2;
}

Assistant:

bool cmCTestVC::InitialCheckout(const char* command)
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   First perform the initial checkout: " << command << "\n");

  // Make the parent directory in which to perform the checkout.
  std::string parent = cmSystemTools::GetFilenamePath(this->SourceDirectory);
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Perform checkout in directory: " << parent << "\n");
  if (!cmSystemTools::MakeDirectory(parent)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create directory: " << parent << std::endl);
    return false;
  }

  // Construct the initial checkout command line.
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);
  std::vector<char const*> vc_co;
  vc_co.reserve(args.size() + 1);
  for (std::string const& arg : args) {
    vc_co.push_back(arg.c_str());
  }
  vc_co.push_back(nullptr);

  // Run the initial checkout command and log its output.
  this->Log << "--- Begin Initial Checkout ---\n";
  OutputLogger out(this->Log, "co-out> ");
  OutputLogger err(this->Log, "co-err> ");
  bool result = this->RunChild(&vc_co[0], &out, &err, parent.c_str());
  this->Log << "--- End Initial Checkout ---\n";
  if (!result) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Initial checkout failed!" << std::endl);
  }
  return result;
}